

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O3

bool bssl::string_util::Base64Encode(string_view *input,string *output)

{
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  size_t len;
  vector<char,_std::allocator<char>_> encoded;
  allocator_type local_41;
  size_type local_40;
  vector<char,_std::allocator<char>_> local_38;
  
  iVar1 = EVP_EncodedLength(&local_40,input->_M_len);
  if (iVar1 == 0) {
    bVar2 = false;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&local_38,local_40,&local_41);
    iVar1 = EVP_EncodeBlock((uchar *)local_38.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start,(uchar *)input->_M_str
                            ,(int)input->_M_len);
    local_40 = CONCAT44(extraout_var,iVar1);
    bVar2 = local_40 != 0;
    if (bVar2) {
      ::std::__cxx11::string::_M_replace
                ((ulong)output,0,(char *)output->_M_string_length,
                 (ulong)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    }
    if ((uchar *)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool Base64Encode(const std::string_view &input, std::string *output) {
  size_t len;
  if (!EVP_EncodedLength(&len, input.size())) {
    return false;
  }
  std::vector<char> encoded(len);
  len = EVP_EncodeBlock(reinterpret_cast<uint8_t *>(encoded.data()),
                        reinterpret_cast<const uint8_t *>(input.data()),
                        input.size());
  if (!len) {
    return false;
  }
  output->assign(encoded.data(), len);
  return true;
}